

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

void VP8LHistogramCreate(VP8LHistogram *h,VP8LBackwardRefs *refs,int palette_code_bits)

{
  int iVar1;
  uint32_t *puVar2;
  int iVar3;
  
  if (-1 < palette_code_bits) {
    h->palette_code_bits = palette_code_bits;
  }
  iVar1 = h->palette_code_bits;
  puVar2 = h->literal;
  iVar3 = (4 << ((byte)iVar1 & 0x1f)) + 0x1150;
  if (iVar1 < 1) {
    iVar3 = 0x1150;
  }
  memset(h,0,(long)iVar3);
  h->palette_code_bits = iVar1;
  h->literal = puVar2;
  h->trivial_symbol[0] = 0xffff;
  h->trivial_symbol[1] = 0xffff;
  h->trivial_symbol[2] = 0xffff;
  h->trivial_symbol[3] = 0xffff;
  h->trivial_symbol[4] = 0xffff;
  builtin_memcpy(h->is_used,"\x01\x01\x01\x01\x01",5);
  h->bit_cost = 0;
  h->costs[0] = 0;
  h->costs[1] = 0;
  h->costs[2] = 0;
  h->costs[3] = 0;
  h->costs[4] = 0;
  VP8LHistogramStoreRefs(refs,(_func_int_int_int *)0x0,0,h);
  return;
}

Assistant:

void VP8LHistogramCreate(VP8LHistogram* const h,
                         const VP8LBackwardRefs* const refs,
                         int palette_code_bits) {
  if (palette_code_bits >= 0) {
    h->palette_code_bits = palette_code_bits;
  }
  HistogramClear(h);
  VP8LHistogramStoreRefs(refs, /*distance_modifier=*/NULL,
                         /*distance_modifier_arg0=*/0, h);
}